

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O1

ec_key_st * EVP_PKEY_get1_EC_KEY(EVP_PKEY *pkey)

{
  EC_KEY *key;
  
  if (pkey->save_type == 0x198) {
    key = *(EC_KEY **)&pkey->references;
  }
  else {
    key = (EC_KEY *)0x0;
    ERR_put_error(6,0,0x6a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                  ,0x112);
  }
  if (key != (EC_KEY *)0x0) {
    EC_KEY_up_ref(key);
  }
  return key;
}

Assistant:

EC_KEY *EVP_PKEY_get1_EC_KEY(const EVP_PKEY *pkey) {
  EC_KEY *ec_key = EVP_PKEY_get0_EC_KEY(pkey);
  if (ec_key != NULL) {
    EC_KEY_up_ref(ec_key);
  }
  return ec_key;
}